

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)2>::decodeB
          (Predecoder<(InstructionSet::M68k::Model)2> *this,uint16_t instruction)

{
  ushort uVar1;
  uint16_t instruction_local;
  Predecoder<(InstructionSet::M68k::Model)2> *this_local;
  
  uVar1 = instruction & 0x1f8;
  if (uVar1 == 0x108) {
    this_local._4_4_ = decode<(unsigned_char)210,true>(this,instruction);
  }
  else if (uVar1 == 0x148) {
    this_local._4_4_ = decode<(unsigned_char)211,true>(this,instruction);
  }
  else if (uVar1 == 0x188) {
    this_local._4_4_ = decode<(unsigned_char)212,true>(this,instruction);
  }
  else {
    uVar1 = instruction & 0x1c0;
    if ((instruction & 0x1c0) == 0) {
      this_local._4_4_ = decode<(unsigned_char)43,true>(this,instruction);
    }
    else if (uVar1 == 0x40) {
      this_local._4_4_ = decode<(unsigned_char)44,true>(this,instruction);
    }
    else if (uVar1 == 0x80) {
      this_local._4_4_ = decode<(unsigned_char)45,true>(this,instruction);
    }
    else if (uVar1 == 0xc0) {
      this_local._4_4_ = decode<(unsigned_char)46,true>(this,instruction);
    }
    else if (uVar1 == 0x100) {
      this_local._4_4_ = decode<(unsigned_char)110,true>(this,instruction);
    }
    else if (uVar1 == 0x140) {
      this_local._4_4_ = decode<(unsigned_char)111,true>(this,instruction);
    }
    else if (uVar1 == 0x180) {
      this_local._4_4_ = decode<(unsigned_char)112,true>(this,instruction);
    }
    else if (uVar1 == 0x1c0) {
      this_local._4_4_ = decode<(unsigned_char)47,true>(this,instruction);
    }
    else {
      memset((void *)((long)&this_local + 4),0,4);
      Preinstruction::Preinstruction((Preinstruction *)((long)&this_local + 4));
    }
  }
  return this_local._4_4_;
}

Assistant:

Preinstruction Predecoder<model>::decodeB(uint16_t instruction) {
	using Op = Operation;

	switch(instruction & 0x1f8) {
		// 4-81 (p185)
		case 0x108:	Decode(CMPMb);
		case 0x148:	Decode(CMPMw);
		case 0x188:	Decode(CMPMl);

		default:	break;
	}

	switch(instruction & 0x1c0) {
		// 4-75 (p179)
		case 0x000:	Decode(Op::CMPb);
		case 0x040:	Decode(Op::CMPw);
		case 0x080:	Decode(Op::CMPl);

		// 4-77 (p181)
		case 0x0c0:	Decode(Op::CMPAw);
		case 0x1c0:	Decode(Op::CMPAl);

		// 4-100 (p204)
		case 0x100:	Decode(Op::EORb);
		case 0x140:	Decode(Op::EORw);
		case 0x180:	Decode(Op::EORl);

		default:	break;
	}

	return Preinstruction();
}